

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.h
# Opt level: O0

void __thiscall
AddPointBlock<3U>::operator()
          (AddPointBlock<3U> *this,int gid,Bounds *core,Bounds *param_4,Bounds *domain,RCLink *link)

{
  RegularLink<diy::Bounds<float>_> *pRVar1;
  void *n;
  Link *in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  RegularLink<diy::Bounds<float>_> *in_R9;
  Master *unaff_retaddr;
  Master *m;
  RCLink *l;
  Block *b;
  Bounds *in_stack_ffffffffffffffa8;
  PointBlock<3U> *in_stack_ffffffffffffffb0;
  Bounds *in_stack_ffffffffffffffb8;
  PointBlock<3U> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_fffffffffffffff0;
  int gid__;
  
  gid__ = (int)((ulong)in_RDI >> 0x20);
  pRVar1 = (RegularLink<diy::Bounds<float>_> *)operator_new(0x118);
  PointBlock<3U>::PointBlock(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  n = operator_new(0x1b8);
  diy::RegularLink<diy::Bounds<float>_>::RegularLink(in_R9,pRVar1);
  diy::Master::add(unaff_retaddr,gid__,(void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  PointBlock<3U>::generate_points(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(size_t)n);
  return;
}

Assistant:

void  operator()(int gid,                // block global id
                     const Bounds& core,     // block bounds without any ghost added
                     const Bounds&,          // block bounds including any ghost region added
                     const Bounds& domain,   // global data bounds
                     const RCLink& link)     // neighborhood
        const
        {
            Block*          b   = new Block(core);
            RCLink*         l   = new RCLink(link);
            diy::Master&    m   = const_cast<diy::Master&>(master);

            m.add(gid, b, l); // add block to the master (mandatory)

            b->generate_points(domain, num_points); // initialize block data (typical)
        }